

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mul.c
# Opt level: O0

void zzMul(word *c,word *a,size_t n,word *b,size_t m,void *stack)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  long in_RCX;
  ulong uVar4;
  ulong in_RDX;
  long in_RSI;
  word *in_RDI;
  ulong in_R8;
  size_t j;
  size_t i;
  dword prod;
  word carry;
  ulong local_58;
  ulong local_50;
  ulong local_38;
  
  wwSetZero(in_RDI,in_RDX + in_R8);
  for (local_50 = 0; local_38 = 0, local_50 < in_RDX; local_50 = local_50 + 1) {
    for (local_58 = 0; local_58 < in_R8; local_58 = local_58 + 1) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *(ulong *)(in_RSI + local_50 * 8);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)(in_RCX + local_58 * 8);
      uVar3 = SUB168(auVar1 * auVar2,0);
      uVar4 = uVar3 + local_38;
      local_38 = SUB168(auVar1 * auVar2,8) + (ulong)CARRY8(uVar3,local_38) +
                 (ulong)CARRY8(uVar4,in_RDI[local_50 + local_58]);
      in_RDI[local_50 + local_58] = uVar4 + in_RDI[local_50 + local_58];
    }
    in_RDI[local_50 + local_58] = local_38;
  }
  return;
}

Assistant:

void zzMul(word c[], const word a[], size_t n, const word b[], size_t m, 
	void* stack)
{
	register word carry = 0;
	register dword prod;
	size_t i, j;
	ASSERT(wwIsDisjoint2(a, n, c, n + m));
	ASSERT(wwIsDisjoint2(b, m, c, n + m));
	wwSetZero(c, n + m);
	for (i = 0; i < n; ++i)
	{
		for (j = 0; j < m; ++j)
		{
			zzMul11(prod, a[i], b[j]);
			prod += carry;
			prod += c[i + j];
			c[i + j] = (word)prod;
			carry = (word)(prod >> B_PER_W);
		}
		c[i + j] = carry;
		carry = 0;
	}
	prod = 0;
}